

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O3

void cmime_header_set_value(CMimeHeader_T *header,char *value,int overwrite)

{
  size_t sVar1;
  ulong uVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t __size;
  ulong uVar5;
  
  if (header != (CMimeHeader_T *)0x0) {
    uVar2 = header->count;
    if (overwrite == 1) {
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          if (header->value[uVar5] != (char *)0x0) {
            free(header->value[uVar5]);
            uVar2 = header->count;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar2);
      }
      header->count = 0;
      __size = 8;
    }
    else {
      __size = uVar2 * 8 + 8;
    }
    ppcVar3 = (char **)realloc(header->value,__size);
    if (value == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = strdup(value);
    }
    sVar1 = header->count;
    ppcVar3[sVar1] = pcVar4;
    header->value = ppcVar3;
    header->count = sVar1 + 1;
    return;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x44,"void cmime_header_set_value(CMimeHeader_T *, const char *, int)");
}

Assistant:

void cmime_header_set_value(CMimeHeader_T *header, const char *value, int overwrite) {
    char **tmp = NULL;
    size_t i;
    assert(header);

    if (overwrite==1) {
        for(i = 0; i < header->count; i++) {
            if (header->value[i] != NULL) 
                free(header->value[i]);
        }
        header->count = 0;
    }

    tmp = realloc(header->value, (sizeof( *tmp) * (header->count+1)));
    if (value != NULL)
        tmp[header->count] = strdup(value);
    else 
        tmp[header->count] = NULL;
    header->value = tmp;
    
    header->count++;
}